

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::MarshalAttributes(BP5Writer *this)

{
  _Hash_node_base *p_Var1;
  IO *pIVar2;
  int iVar3;
  AttrMap *pAVar4;
  Attribute<signed_char> *pAVar5;
  Attribute<char> *pAVar6;
  Attribute<std::complex<float>_> *pAVar7;
  Attribute<unsigned_char> *pAVar8;
  Attribute<std::complex<double>_> *pAVar9;
  Attribute<double> *pAVar10;
  Attribute<int> *pAVar11;
  Attribute<long> *pAVar12;
  Attribute<unsigned_long> *pAVar13;
  Attribute<short> *pAVar14;
  Attribute<unsigned_short> *pAVar15;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar16;
  Attribute<unsigned_int> *pAVar17;
  Attribute<long_double> *pAVar18;
  Attribute<float> *pAVar19;
  pointer Data;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  complex<float> *Data_00;
  uchar *Data_01;
  complex<double> *Data_02;
  double *Data_03;
  int *Data_04;
  long *Data_05;
  unsigned_long *Data_06;
  char *pcVar23;
  short *Data_07;
  unsigned_short *Data_08;
  uint *Data_09;
  longdouble *Data_10;
  float *Data_11;
  __node_base *p_Var24;
  uint uVar25;
  allocator local_262;
  allocator local_261;
  BP5Serializer *local_260;
  string local_258;
  string name;
  ScopedTimer __var2488;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((MarshalAttributes()::__var488 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&MarshalAttributes()::__var488), iVar3 != 0)) {
    MarshalAttributes::__var488 = (void *)ps_timer_create_("BP5Writer::MarshalAttributes");
    __cxa_guard_release(&MarshalAttributes()::__var488);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2488,MarshalAttributes::__var488);
  pAVar4 = IO::GetAttributes_abi_cxx11_((this->super_Engine).m_IO);
  if (this->m_MarshalAttributesNecessary != false) {
    this->m_MarshalAttributesNecessary = false;
    p_Var24 = &(pAVar4->_M_h)._M_before_begin;
    local_260 = &this->m_BP5Serializer;
    while( true ) {
      p_Var24 = p_Var24->_M_nxt;
      if (p_Var24 == (__node_base *)0x0) break;
      std::__cxx11::string::string((string *)&name,(string *)(p_Var24 + 1));
      p_Var1 = p_Var24[5]._M_nxt;
      uVar25 = 0xffffffff;
      if (*(char *)&p_Var1[7]._M_nxt == '\0') {
        uVar25 = *(uint *)&p_Var1[6]._M_nxt;
      }
      switch(*(undefined4 *)&p_Var1[5]._M_nxt) {
      case 1:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_90,"/",&local_261);
        pAVar5 = IO::InquireAttribute<signed_char>(pIVar2,&name,&local_258,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar5->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar5->super_AttributeBase).m_Elements;
          pcVar23 = (pAVar5->m_DataArray).
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          pcVar23 = &pAVar5->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar5->super_AttributeBase).m_Name._M_dataplus._M_p,Int8,1,sVar22,
                   pcVar23);
        break;
      case 2:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_b0,"/",&local_261);
        pAVar14 = IO::InquireAttribute<short>(pIVar2,&name,&local_258,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar14->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar14->super_AttributeBase).m_Elements;
          Data_07 = (pAVar14->m_DataArray).super__Vector_base<short,_std::allocator<short>_>._M_impl
                    .super__Vector_impl_data._M_start;
        }
        else {
          Data_07 = &pAVar14->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar14->super_AttributeBase).m_Name._M_dataplus._M_p,Int16,2,sVar22,
                   Data_07);
        break;
      case 3:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_d0,"/",&local_261);
        pAVar11 = IO::InquireAttribute<int>(pIVar2,&name,&local_258,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar11->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar11->super_AttributeBase).m_Elements;
          Data_04 = (pAVar11->m_DataArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_04 = &pAVar11->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar11->super_AttributeBase).m_Name._M_dataplus._M_p,Int32,4,sVar22,
                   Data_04);
        break;
      case 4:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_f0,"/",&local_261);
        pAVar12 = IO::InquireAttribute<long>(pIVar2,&name,&local_258,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar12->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar12->super_AttributeBase).m_Elements;
          Data_05 = (pAVar12->m_DataArray).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_05 = &pAVar12->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar12->super_AttributeBase).m_Name._M_dataplus._M_p,Int64,8,sVar22,
                   Data_05);
        break;
      case 5:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_110,"/",&local_261);
        pAVar8 = IO::InquireAttribute<unsigned_char>(pIVar2,&name,&local_258,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar8->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar8->super_AttributeBase).m_Elements;
          Data_01 = (pAVar8->m_DataArray).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_01 = &pAVar8->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar8->super_AttributeBase).m_Name._M_dataplus._M_p,UInt8,1,sVar22,
                   Data_01);
        break;
      case 6:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_130,"/",&local_261);
        pAVar15 = IO::InquireAttribute<unsigned_short>(pIVar2,&name,&local_258,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar15->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar15->super_AttributeBase).m_Elements;
          Data_08 = (pAVar15->m_DataArray).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_08 = &pAVar15->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar15->super_AttributeBase).m_Name._M_dataplus._M_p,UInt16,2,sVar22,
                   Data_08);
        break;
      case 7:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_150,"/",&local_261);
        pAVar17 = IO::InquireAttribute<unsigned_int>(pIVar2,&name,&local_258,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar17->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar17->super_AttributeBase).m_Elements;
          Data_09 = (pAVar17->m_DataArray).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_09 = &pAVar17->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar17->super_AttributeBase).m_Name._M_dataplus._M_p,UInt32,4,sVar22,
                   Data_09);
        break;
      case 8:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_170,"/",&local_261);
        pAVar13 = IO::InquireAttribute<unsigned_long>(pIVar2,&name,&local_258,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar13->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar13->super_AttributeBase).m_Elements;
          Data_06 = (pAVar13->m_DataArray).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_06 = &pAVar13->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar13->super_AttributeBase).m_Name._M_dataplus._M_p,UInt64,8,sVar22,
                   Data_06);
        break;
      case 9:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_190,"/",&local_261);
        pAVar19 = IO::InquireAttribute<float>(pIVar2,&name,&local_258,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar19->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar19->super_AttributeBase).m_Elements;
          Data_11 = (pAVar19->m_DataArray).super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start;
        }
        else {
          Data_11 = &pAVar19->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar19->super_AttributeBase).m_Name._M_dataplus._M_p,Float,4,sVar22,
                   Data_11);
        break;
      case 10:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_1b0,"/",&local_261);
        pAVar10 = IO::InquireAttribute<double>(pIVar2,&name,&local_258,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar10->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar10->super_AttributeBase).m_Elements;
          Data_03 = (pAVar10->m_DataArray).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          Data_03 = &pAVar10->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar10->super_AttributeBase).m_Name._M_dataplus._M_p,Double,8,sVar22,
                   Data_03);
        break;
      case 0xb:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_1d0,"/",&local_261);
        pAVar18 = IO::InquireAttribute<long_double>(pIVar2,&name,&local_258,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar18->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar18->super_AttributeBase).m_Elements;
          Data_10 = (pAVar18->m_DataArray).
                    super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          Data_10 = &pAVar18->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar18->super_AttributeBase).m_Name._M_dataplus._M_p,LongDouble,0x10,
                   sVar22,Data_10);
        break;
      case 0xc:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_1f0,"/",&local_261);
        pAVar7 = IO::InquireAttribute<std::complex<float>>(pIVar2,&name,&local_258,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar7->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar7->super_AttributeBase).m_Elements;
          Data_00 = (pAVar7->m_DataArray).
                    super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          Data_00 = &pAVar7->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar7->super_AttributeBase).m_Name._M_dataplus._M_p,FloatComplex,8,
                   sVar22,Data_00);
        break;
      case 0xd:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_210,"/",&local_261);
        pAVar9 = IO::InquireAttribute<std::complex<double>>(pIVar2,&name,&local_258,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar9->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar9->super_AttributeBase).m_Elements;
          Data_02 = (pAVar9->m_DataArray).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          Data_02 = &pAVar9->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar9->super_AttributeBase).m_Name._M_dataplus._M_p,DoubleComplex,
                   0x10,sVar22,Data_02);
        break;
      case 0xe:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_50,"/",&local_261);
        pAVar16 = IO::InquireAttribute<std::__cxx11::string>(pIVar2,&name,&local_258,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar16->super_AttributeBase).m_IsSingleValue == true) {
          Data = (pAVar16->m_DataSingleValue)._M_dataplus._M_p;
        }
        else {
          Data = (pointer)malloc((long)(int)uVar25 * 8);
          uVar20 = 0;
          if (0 < (int)uVar25) {
            uVar20 = (ulong)uVar25;
          }
          for (lVar21 = 0; uVar20 * 8 != lVar21; lVar21 = lVar21 + 8) {
            *(undefined8 *)(Data + lVar21) =
                 *(undefined8 *)
                  ((long)&(((pAVar16->m_DataArray).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                  lVar21 * 4);
          }
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,name._M_dataplus._M_p,String,8,(long)(int)uVar25,Data);
        if ((pAVar16->super_AttributeBase).m_IsSingleValue == false) {
          free(Data);
        }
        break;
      case 0xf:
        pIVar2 = (this->super_Engine).m_IO;
        std::__cxx11::string::string((string *)&local_258,"",&local_262);
        std::__cxx11::string::string((string *)&local_70,"/",&local_261);
        pAVar6 = IO::InquireAttribute<char>(pIVar2,&name,&local_258,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_258);
        if ((pAVar6->super_AttributeBase).m_IsSingleValue == false) {
          sVar22 = (size_t)(int)(pAVar6->super_AttributeBase).m_Elements;
          pcVar23 = (pAVar6->m_DataArray).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          pcVar23 = &pAVar6->m_DataSingleValue;
          sVar22 = 0xffffffffffffffff;
        }
        adios2::format::BP5Serializer::MarshalAttribute
                  (local_260,(pAVar6->super_AttributeBase).m_Name._M_dataplus._M_p,Char,1,sVar22,
                   pcVar23);
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2488);
  return;
}

Assistant:

void BP5Writer::MarshalAttributes()
{
    PERFSTUBS_SCOPED_TIMER("BP5Writer::MarshalAttributes");
    const auto &attributes = m_IO.GetAttributes();

    // if there are no new attributes, nothing to do
    if (!m_MarshalAttributesNecessary)
    {
        return;
    }
    m_MarshalAttributesNecessary = false;

    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        auto baseAttr = &attributePair.second;
        const DataType type((*baseAttr)->m_Type);
        int element_count = -1;

        if (!attributePair.second->m_IsSingleValue)
        {
            element_count = (int)(*baseAttr)->m_Elements;
        }

        if (type == DataType::None)
        {
        }
        else if (type == helper::GetDataType<std::string>())
        {
            core::Attribute<std::string> &attribute = *m_IO.InquireAttribute<std::string>(name);
            void *data_addr;
            if (attribute.m_IsSingleValue)
            {
                data_addr = (void *)attribute.m_DataSingleValue.c_str();
            }
            else
            {
                const char **tmp = (const char **)malloc(sizeof(char *) * element_count);
                for (int i = 0; i < element_count; i++)
                {
                    auto str = &attribute.m_DataArray[i];
                    tmp[i] = str->c_str();
                }
                // tmp will be free'd after final attribute marshalling
                data_addr = (void *)tmp;
            }

            m_BP5Serializer.MarshalAttribute(name.c_str(), type, sizeof(char *), element_count,
                                             data_addr);
            if (!attribute.m_IsSingleValue)
            {
                // array of strings
                free(data_addr);
            }
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *m_IO.InquireAttribute<T>(name);                           \
        int element_count = -1;                                                                    \
        void *data_addr = &attribute.m_DataSingleValue;                                            \
        if (!attribute.m_IsSingleValue)                                                            \
        {                                                                                          \
            element_count = (int)attribute.m_Elements;                                             \
            data_addr = attribute.m_DataArray.data();                                              \
        }                                                                                          \
        m_BP5Serializer.MarshalAttribute(attribute.m_Name.c_str(), type, sizeof(T), element_count, \
                                         data_addr);                                               \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
}